

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O3

handle_t __thiscall sc_core::sc_plist_base::push_front(sc_plist_base *this,void *d)

{
  handle_t psVar1;
  sc_plist_elem *psVar2;
  
  psVar1 = (handle_t)sc_mempool::allocate(0x18);
  psVar2 = this->head;
  psVar1->data = d;
  psVar1->prev = (sc_plist_elem *)0x0;
  psVar1->next = psVar2;
  if (psVar2 == (sc_plist_elem *)0x0) {
    psVar2 = (sc_plist_elem *)this;
  }
  psVar2->prev = psVar1;
  this->head = psVar1;
  return psVar1;
}

Assistant:

sc_plist_base::handle_t
sc_plist_base::push_front( void* d )
{
    handle_t q = new sc_plist_elem( d, (sc_plist_elem*) 0, head );
    if (head) {
        head->prev = q;
        head = q;
    }
    else {
        head = tail = q;
    }
    return q;
}